

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O1

void ggml_build_forward_impl(ggml_cgraph *cgraph,ggml_tensor *tensor,_Bool expand)

{
  int iVar1;
  undefined7 in_register_00000011;
  ggml_tensor *tensor_00;
  ggml_cgraph *cgraph_00;
  
  if ((int)CONCAT71(in_register_00000011,expand) == 0) {
    cgraph->n_nodes = 0;
    cgraph->n_leafs = 0;
  }
  iVar1 = cgraph->n_nodes;
  tensor_00 = tensor;
  cgraph_00 = cgraph;
  ggml_visit_parents(cgraph,tensor);
  if ((iVar1 < cgraph->n_nodes) && (cgraph->nodes[(long)cgraph->n_nodes + -1] != tensor)) {
    ggml_build_forward_impl_cold_1();
    memset(cgraph_00,0,0x18038);
    ggml_build_forward_impl(cgraph_00,tensor_00,false);
    return;
  }
  return;
}

Assistant:

static void ggml_build_forward_impl(struct ggml_cgraph * cgraph, struct ggml_tensor * tensor, bool expand) {
    if (!expand) {
        cgraph->n_nodes = 0;
        cgraph->n_leafs = 0;
    }

    const int n0 = cgraph->n_nodes;
    UNUSED(n0);

    ggml_visit_parents(cgraph, tensor);

    const int n_new = cgraph->n_nodes - n0;
    GGML_PRINT_DEBUG("%s: visited %d new nodes\n", __func__, n_new);

    if (n_new > 0) {
        // the last added node should always be starting point
        GGML_ASSERT(cgraph->nodes[cgraph->n_nodes - 1] == tensor);
    }
}